

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

bool __thiscall
Parameter<std::__cxx11::string>::internalSetData<std::pair<int,int>>
          (Parameter<std::__cxx11::string> *this,pair<int,_int> data)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  undefined1 *local_20;
  undefined8 local_18;
  undefined1 local_10 [16];
  
  local_20 = local_10;
  local_18 = 0;
  local_10[0] = 0;
  std::__cxx11::string::~string((string *)&local_20);
  return false;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }